

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O1

int luv_spawn(lua_State *L)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  lua_Integer lVar4;
  uv_stream_t *handle;
  uv_process_t *process;
  luv_handle_t *plVar5;
  uv_loop_t *loop;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  ulong n;
  size_t sVar9;
  bool bVar10;
  uv_process_options_t options;
  uv_os_fd_t fd;
  uv_process_options_t local_78;
  uv_os_fd_t local_34;
  
  local_78.file = (char *)0x0;
  local_78.stdio = (uv_stdio_container_t *)0x0;
  local_78.uid = 0;
  local_78.gid = 0;
  local_78.cwd = (char *)0x0;
  local_78.flags = 0;
  local_78.stdio_count = 0;
  local_78.args = (char **)0x0;
  local_78.env = (char **)0x0;
  local_78.exit_cb = exit_cb;
  local_78.file = luaL_checklstring(L,1,(size_t *)0x0);
  local_78._40_8_ = local_78._40_8_ & 0xffffffff00000000;
  luaL_checktype(L,2,5);
  lua_getfield(L,2,"args");
  iVar1 = lua_type(L,-1);
  if (iVar1 == 5) {
    sVar2 = lua_rawlen(L,-1);
    uVar8 = sVar2 + 1;
  }
  else {
    iVar1 = lua_type(L,-1);
    if (iVar1 != 0) {
      free(local_78.args);
      free(local_78.stdio);
      free(local_78.env);
      pcVar3 = "args option must be table";
      iVar1 = 3;
      goto LAB_0014996e;
    }
    uVar8 = 1;
  }
  local_78.args = (char **)malloc(uVar8 * 8 + 8);
  if (local_78.args == (char **)0x0) {
    free((void *)0x0);
    free(local_78.stdio);
    free(local_78.env);
    pcVar3 = "Problem allocating args";
LAB_00149aea:
    iVar1 = luaL_error(L,pcVar3);
    return iVar1;
  }
  *local_78.args = local_78.file;
  if (1 < uVar8) {
    n = 1;
    do {
      lua_rawgeti(L,-1,n);
      pcVar3 = lua_tolstring(L,-1,(size_t *)0x0);
      local_78.args[n] = pcVar3;
      lua_settop(L,-2);
      n = n + 1;
    } while (uVar8 != n);
  }
  local_78.args[uVar8] = (char *)0x0;
  lua_settop(L,-2);
  lua_getfield(L,2,"stdio");
  iVar1 = lua_type(L,-1);
  if (iVar1 == 5) {
    sVar2 = lua_rawlen(L,-1);
    local_78.stdio_count = (int)sVar2;
    local_78.stdio = (uv_stdio_container_t *)malloc(sVar2 << 4);
    if (local_78.stdio == (uv_stdio_container_t *)0x0) {
      free(local_78.args);
      free(local_78.stdio);
      free(local_78.env);
      pcVar3 = "Problem allocating stdio";
      goto LAB_00149aea;
    }
    if (sVar2 != 0) {
      lVar7 = 0;
      sVar9 = 1;
      do {
        lua_rawgeti(L,-1,sVar9);
        iVar1 = lua_type(L,-1);
        if (iVar1 == 3) {
          *(undefined4 *)((long)&(local_78.stdio)->flags + lVar7) = 2;
          lVar4 = lua_tointegerx(L,-1,(int *)0x0);
          *(int *)((long)&(local_78.stdio)->data + lVar7) = (int)lVar4;
        }
        else {
          iVar1 = lua_type(L,-1);
          if (iVar1 == 7) {
            handle = luv_check_stream(L,-1);
            iVar1 = uv_fileno((uv_handle_t *)handle,&local_34);
            if (((iVar1 == -9) || (uVar6 = 4, iVar1 == -0x16)) &&
               (uVar6 = (uint)(sVar9 - 4 < 0xfffffffffffffffe) << 4 | 0x21, sVar9 == 1)) {
              uVar6 = 0x11;
            }
            *(uint *)((long)&(local_78.stdio)->flags + lVar7) = uVar6;
            *(uv_stream_t **)((long)&(local_78.stdio)->data + lVar7) = handle;
          }
          else {
            iVar1 = lua_type(L,-1);
            if (iVar1 != 0) {
              free(local_78.args);
              free(local_78.stdio);
              free(local_78.env);
              pcVar3 = "stdio table entries must be nil, uv_stream_t, or integer";
              goto LAB_00149dbf;
            }
            *(undefined4 *)((long)&(local_78.stdio)->flags + lVar7) = 0;
          }
        }
        lua_settop(L,-2);
        lVar7 = lVar7 + 0x10;
        bVar10 = sVar9 != sVar2;
        sVar9 = sVar9 + 1;
      } while (bVar10);
    }
  }
  else {
    iVar1 = lua_type(L,-1);
    if (iVar1 != 0) {
      free(local_78.args);
      free(local_78.stdio);
      free(local_78.env);
      pcVar3 = "stdio option must be table";
      iVar1 = 2;
LAB_0014996e:
      iVar1 = luaL_argerror(L,iVar1,pcVar3);
      return iVar1;
    }
  }
  lua_settop(L,-2);
  lua_getfield(L,2,"env");
  iVar1 = lua_type(L,-1);
  if (iVar1 == 5) {
    sVar2 = lua_rawlen(L,-1);
    local_78.env = (char **)malloc(sVar2 * 8 + 8);
    if (local_78.env == (char **)0x0) {
      free(local_78.args);
      free(local_78.stdio);
      free(local_78.env);
      iVar1 = luaL_error(L,"Problem allocating env");
      return iVar1;
    }
    if (sVar2 != 0) {
      sVar9 = 1;
      do {
        lua_rawgeti(L,-1,sVar9);
        pcVar3 = lua_tolstring(L,-1,(size_t *)0x0);
        local_78.env[sVar9 - 1] = pcVar3;
        lua_settop(L,-2);
        bVar10 = sVar9 != sVar2;
        sVar9 = sVar9 + 1;
      } while (bVar10);
    }
    local_78.env[sVar2] = (char *)0x0;
LAB_00149a7c:
    lua_settop(L,-2);
    lua_getfield(L,2,"cwd");
    iVar1 = lua_type(L,-1);
    if (iVar1 == 4) {
      local_78.cwd = lua_tolstring(L,-1,(size_t *)0x0);
    }
    else {
      iVar1 = lua_type(L,-1);
      if (iVar1 != 0) {
        free(local_78.args);
        free(local_78.stdio);
        free(local_78.env);
        pcVar3 = "cwd option must be string";
        goto LAB_00149dbf;
      }
    }
    lua_settop(L,-2);
    lua_getfield(L,2,"uid");
    iVar1 = lua_type(L,-1);
    if (iVar1 == 3) {
      lVar4 = lua_tointegerx(L,-1,(int *)0x0);
      local_78.uid = (uv_uid_t)lVar4;
      local_78._40_8_ = local_78._40_8_ | 1;
    }
    else {
      iVar1 = lua_type(L,-1);
      if (iVar1 != 0) {
        free(local_78.args);
        free(local_78.stdio);
        free(local_78.env);
        pcVar3 = "uid option must be number";
        goto LAB_00149dbf;
      }
    }
    lua_settop(L,-2);
    lua_getfield(L,2,"gid");
    iVar1 = lua_type(L,-1);
    if (iVar1 == 3) {
      lVar4 = lua_tointegerx(L,-1,(int *)0x0);
      local_78.gid = (uv_gid_t)lVar4;
      local_78._40_8_ = local_78._40_8_ | 2;
    }
    else {
      iVar1 = lua_type(L,-1);
      if (iVar1 != 0) {
        luv_clean_options(&local_78);
        pcVar3 = "gid option must be number";
        goto LAB_00149dbf;
      }
    }
    lua_settop(L,-2);
    lua_getfield(L,2,"verbatim");
    iVar1 = lua_toboolean(L,-1);
    if (iVar1 != 0) {
      local_78._40_8_ = local_78._40_8_ | 4;
    }
    lua_settop(L,-2);
    lua_getfield(L,2,"detached");
    iVar1 = lua_toboolean(L,-1);
    if (iVar1 != 0) {
      local_78._40_8_ = local_78._40_8_ | 8;
    }
    lua_settop(L,-2);
    lua_getfield(L,2,"hide");
    iVar1 = lua_toboolean(L,-1);
    if (iVar1 != 0) {
      local_78._40_8_ = local_78._40_8_ | 0x10;
    }
    lua_settop(L,-2);
    process = (uv_process_t *)luv_newuserdata(L,0x88);
    process->type = UV_PROCESS;
    plVar5 = luv_setup_handle(L);
    process->data = plVar5;
    iVar1 = lua_type(L,3);
    if (0 < iVar1) {
      luv_check_callback(L,(luv_handle_t *)process->data,1,3);
    }
    loop = luv_loop(L);
    iVar1 = uv_spawn(loop,process,&local_78);
    free(local_78.args);
    free(local_78.stdio);
    free(local_78.env);
    if (iVar1 < 0) {
      uv_close((uv_handle_t *)process,luv_spawn_close_cb);
      luv_error(L,iVar1);
      iVar1 = 3;
    }
    else {
      lua_pushinteger(L,(long)process->pid);
      iVar1 = 2;
    }
  }
  else {
    iVar1 = lua_type(L,-1);
    if (iVar1 == 0) goto LAB_00149a7c;
    free(local_78.args);
    free(local_78.stdio);
    free(local_78.env);
    pcVar3 = "env option must be table";
LAB_00149dbf:
    iVar1 = luaL_argerror(L,2,pcVar3);
  }
  return iVar1;
}

Assistant:

static int luv_spawn(lua_State* L) {
  uv_process_t* handle;
  uv_process_options_t options;
  size_t i, len = 0;
  int ret;
  luv_ctx_t* ctx = luv_context(L);

  memset(&options, 0, sizeof(options));
  options.exit_cb = exit_cb;
  options.file = luaL_checkstring(L, 1);
  options.flags = 0;

  // Make sure the 2nd argument is a table
  luaL_checktype(L, 2, LUA_TTABLE);

  // get the args list
  lua_getfield(L, 2, "args");
  // +1 for inserted command at front
  if (lua_type(L, -1) == LUA_TTABLE) {
    len = 1 + lua_rawlen(L, -1);
  }
  else if (lua_type(L, -1) != LUA_TNIL) {
    luv_clean_options(&options);
    return luaL_argerror(L, 3, "args option must be table");
  }
  else {
    len = 1;
  }
  // +1 for null terminator at end
  options.args = (char**)malloc((len + 1) * sizeof(*options.args));
  if (!options.args) {
    luv_clean_options(&options);
    return luaL_error(L, "Problem allocating args");
  }
  options.args[0] = (char*)options.file;
  for (i = 1; i < len; ++i) {
    lua_rawgeti(L, -1, i);
    options.args[i] = (char*)lua_tostring(L, -1);
    lua_pop(L, 1);
  }
  options.args[len] = NULL;
  lua_pop(L, 1);

  // get the stdio list
  lua_getfield(L, 2, "stdio");
  if (lua_type(L, -1) == LUA_TTABLE) {
    options.stdio_count = len = sparse_rawlen(L, -1);
    options.stdio = (uv_stdio_container_t*)malloc(len * sizeof(*options.stdio));
    if (!options.stdio) {
      luv_clean_options(&options);
      return luaL_error(L, "Problem allocating stdio");
    }
    for (i = 0; i < len; ++i) {
      lua_rawgeti(L, -1, i + 1);
      // integers are assumed to be file descripters
      if (lua_type(L, -1) == LUA_TNUMBER) {
        options.stdio[i].flags = UV_INHERIT_FD;
        options.stdio[i].data.fd = lua_tointeger(L, -1);
      }
      // userdata is assumed to be a uv_stream_t instance
      else if (lua_type(L, -1) == LUA_TUSERDATA) {
        uv_os_fd_t fd;
        uv_stream_t* stream = luv_check_stream(L, -1);
        int err = uv_fileno((uv_handle_t*)stream, &fd);
        if (err == UV_EINVAL || err == UV_EBADF) {
          // stdin (fd 0) is read-only, stdout and stderr (fds 1 & 2) are
          // write-only, and all fds > 2 are read-write
          int flags = UV_CREATE_PIPE;
          if (i == 0 || i > 2)
            flags |= UV_READABLE_PIPE;
          if (i != 0)
            flags |= UV_WRITABLE_PIPE;
          options.stdio[i].flags = (uv_stdio_flags)flags;
        }
        else {
          options.stdio[i].flags = UV_INHERIT_STREAM;
        }
        options.stdio[i].data.stream = stream;
      }
      else if (lua_type(L, -1) == LUA_TNIL) {
        options.stdio[i].flags = UV_IGNORE;
      }
      else {
        luv_clean_options(&options);
        return luaL_argerror(L, 2, "stdio table entries must be nil, uv_stream_t, or integer");
      }
      lua_pop(L, 1);
    }
  }
  else if (lua_type(L, -1) != LUA_TNIL) {
    luv_clean_options(&options);
    return luaL_argerror(L, 2, "stdio option must be table");
  }
  lua_pop(L, 1);

  // Get the env
  lua_getfield(L, 2, "env");
  if (lua_type(L, -1) == LUA_TTABLE) {
    len = lua_rawlen(L, -1);
    options.env = (char**)malloc((len + 1) * sizeof(*options.env));
    if (!options.env) {
      luv_clean_options(&options);
      return luaL_error(L, "Problem allocating env");
    }
    for (i = 0; i < len; ++i) {
      lua_rawgeti(L, -1, i + 1);
      options.env[i] = (char*)lua_tostring(L, -1);
      lua_pop(L, 1);
    }
    options.env[len] = NULL;
  }
  else if (lua_type(L, -1) != LUA_TNIL) {
    luv_clean_options(&options);
    return luaL_argerror(L, 2, "env option must be table");
  }
  lua_pop(L, 1);

  // Get the cwd
  lua_getfield(L, 2, "cwd");
  if (lua_type(L, -1) == LUA_TSTRING) {
    options.cwd = (char*)lua_tostring(L, -1);
  }
  else if (lua_type(L, -1) != LUA_TNIL) {
    luv_clean_options(&options);
    return luaL_argerror(L, 2, "cwd option must be string");
  }
  lua_pop(L, 1);

  // Check for uid
  lua_getfield(L, 2, "uid");
  if (lua_type(L, -1) == LUA_TNUMBER) {
    options.uid = lua_tointeger(L, -1);
    options.flags |= UV_PROCESS_SETUID;
  }
  else if (lua_type(L, -1) != LUA_TNIL) {
    luv_clean_options(&options);
    return luaL_argerror(L, 2, "uid option must be number");
  }
  lua_pop(L, 1);

  // Check for gid
  lua_getfield(L, 2, "gid");
  if (lua_type(L, -1) == LUA_TNUMBER) {
    options.gid = lua_tointeger(L, -1);
    options.flags |= UV_PROCESS_SETGID;
  }
  else if (lua_type(L, -1) != LUA_TNIL) {
    luv_clean_options(&options);
    return luaL_argerror(L, 2, "gid option must be number");
  }
  lua_pop(L, 1);

  // Check for the boolean flags
  lua_getfield(L, 2, "verbatim");
  if (lua_toboolean(L, -1)) {
    options.flags |= UV_PROCESS_WINDOWS_VERBATIM_ARGUMENTS;
  }
  lua_pop(L, 1);
  lua_getfield(L, 2, "detached");
  if (lua_toboolean(L, -1)) {
    options.flags |= UV_PROCESS_DETACHED;
  }
  lua_pop(L, 1);
  lua_getfield(L, 2, "hide");
  if (lua_toboolean(L, -1)) {
    options.flags |= UV_PROCESS_WINDOWS_HIDE;
  }
  lua_pop(L, 1);
#if LUV_UV_VERSION_GEQ(1, 24, 0)
  lua_getfield(L, 2, "hide_console");
  if (lua_toboolean(L, -1)) {
    options.flags |= UV_PROCESS_WINDOWS_HIDE_CONSOLE;
  }
  lua_pop(L, 1);
  lua_getfield(L, 2, "hide_gui");
  if (lua_toboolean(L, -1)) {
    options.flags |= UV_PROCESS_WINDOWS_HIDE_GUI;
  }
  lua_pop(L, 1);
#endif

  // this will fill the 3rd argument with nil if it doesn't exist so that
  // the uv_process_t userdata doesn't get treated as the 3rd argument
  lua_settop(L, 3);

  handle = (uv_process_t*)luv_newuserdata(L, sizeof(*handle));
  handle->type = UV_PROCESS;
  handle->data = luv_setup_handle(L, ctx);

  if (!lua_isnoneornil(L, 3)) {
    luv_check_callback(L, (luv_handle_t*)handle->data, LUV_EXIT, 3);
  }

  ret = uv_spawn(ctx->loop, handle, &options);

  luv_clean_options(&options);
  if (ret < 0) {
    /* The async callback is required here because luajit GC may reclaim the
     * luv handle before libuv is done closing it down.
     */
    uv_close((uv_handle_t*)handle, luv_spawn_close_cb);
    return luv_error(L, ret);
  }
  lua_pushinteger(L, handle->pid);
  return 2;
}